

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip-test.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_0::MockAsyncOutputStream::write
          (MockAsyncOutputStream *this,int __fd,void *__buf,size_t __n)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> *piece;
  ArrayPtr<const_unsigned_char> *__end2;
  ArrayPtr<const_unsigned_char> *__begin2;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *__range2;
  MockAsyncOutputStream *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  this_local = (MockAsyncOutputStream *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  __end2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::begin
                     ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  pAVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::end
                     ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  for (; __end2 != pAVar1; __end2 = __end2 + 1) {
    Vector<unsigned_char>::addAll<kj::ArrayPtr<unsigned_char_const>const&>
              ((Vector<unsigned_char> *)(CONCAT44(in_register_00000034,__fd) + 8),__end2);
  }
  Promise<void>::Promise((Promise<void> *)this);
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    for (auto& piece: pieces) {
      bytes.addAll(piece);
    }
    return kj::READY_NOW;
  }